

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool __thiscall tinyusdz::Layer::check_over_primspec(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->_prim_specs)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      bVar1 = false;
      goto LAB_0029018c;
    }
    bVar1 = anon_unknown_240::HasOverRec(0,(PrimSpec *)(p_Var2 + 5),max_depth);
  } while (!bVar1);
  bVar1 = true;
LAB_0029018c:
  this->_has_over_primspec = bVar1;
  return bVar1;
}

Assistant:

bool Layer::check_over_primspec(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasOverRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_over_primspec = ret;
  return _has_over_primspec;
}